

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O1

t_gotfn getfn(t_pd *x,t_symbol *s)

{
  t_pd p_Var1;
  int iVar2;
  t_gotfn *pp_Var3;
  
  p_Var1 = *x;
  iVar2 = p_Var1->c_nmethod;
  if (iVar2 != 0) {
    pp_Var3 = &p_Var1->c_methods->me_fun;
    do {
      if (((t_methodentry *)(pp_Var3 + -1))->me_name == s) {
        return *pp_Var3;
      }
      pp_Var3 = pp_Var3 + 3;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  pd_error(x,"%s: no method for message \'%s\'",p_Var1->c_name->s_name,s->s_name);
  return nullfn;
}

Assistant:

t_gotfn getfn(const t_pd *x, t_symbol *s)
{
    const t_class *c = *x;
    t_methodentry *m, *mlist;
    int i;

#ifdef PDINSTANCE
    mlist = c->c_methods[pd_this->pd_instanceno];
#else
    mlist = c->c_methods;
#endif
    for (i = c->c_nmethod, m = mlist; i--; m++)
        if (m->me_name == s) return(m->me_fun);
    pd_error(x, "%s: no method for message '%s'", c->c_name->s_name, s->s_name);
    return((t_gotfn)nullfn);
}